

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

void llama_sampler_top_n_sigma_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  float *pfVar1;
  llama_token_data *plVar2;
  unkuint9 Var3;
  float *pfVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  pfVar1 = (float *)smpl->ctx;
  plVar2 = cur_p->data;
  uVar6 = cur_p->size;
  pfVar4 = &plVar2->logit;
  fVar13 = plVar2->logit;
  fVar11 = 0.0;
  uVar8 = uVar6;
  while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
    fVar10 = *pfVar4;
    fVar11 = fVar11 + fVar10;
    if (fVar10 <= fVar13) {
      fVar10 = fVar13;
    }
    fVar13 = fVar10;
    pfVar4 = pfVar4 + 3;
  }
  Var3 = (unkuint9)uVar6;
  pfVar4 = &plVar2->logit;
  fVar10 = 0.0;
  while (bVar9 = uVar6 != 0, uVar6 = uVar6 - 1, bVar9) {
    fVar12 = *pfVar4 - fVar11 / (float)(unkint9)Var3;
    fVar10 = fVar10 + fVar12 * fVar12;
    pfVar4 = pfVar4 + 3;
  }
  fVar10 = fVar10 / (float)(unkint9)Var3;
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  sVar5 = cur_p->size;
  lVar7 = 4;
  while (bVar9 = sVar5 != 0, sVar5 = sVar5 - 1, bVar9) {
    fVar11 = fVar13 - *pfVar1 * fVar10;
    pfVar4 = (float *)((long)&cur_p->data->id + lVar7);
    if (*pfVar4 <= fVar11 && fVar11 != *pfVar4) {
      *(undefined4 *)((long)&cur_p->data->id + lVar7) = 0xff800000;
    }
    lVar7 = lVar7 + 0xc;
  }
  llama_sampler_softmax_impl(cur_p);
  return;
}

Assistant:

static void llama_sampler_top_n_sigma_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    const auto * ctx = (llama_sampler_top_n_sigma *) smpl->ctx;

    // find max logit and calculate mean
    float max = cur_p->data[0].logit;
    float logits_sum = 0;
    for (size_t i = 0; i < cur_p->size; ++i) {
        if (cur_p->data[i].logit > max) {
            max = cur_p->data[i].logit;
        }
        logits_sum += cur_p->data[i].logit;
    }
    float mean = logits_sum/cur_p->size;

    // calculate standard deviation
    float acc = 0;
    for (size_t i = 0; i < cur_p->size; ++i) {
        acc += pow(cur_p->data[i].logit - mean, 2);
    }
    float std = sqrt(acc/cur_p->size);

    //apply mask
    for (size_t i = 0; i < cur_p->size; ++i) {
        if (cur_p->data[i].logit < max - (ctx->n * std)) {
            cur_p->data[i].logit = -INFINITY;
        }
    }
    llama_sampler_softmax_impl(cur_p);
}